

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

void dwpt_sym(wpt_object wt,double *inp,int N,double *cA,int len_cA,double *cD)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long local_48;
  long local_40;
  
  if (0 < len_cA) {
    uVar2 = *(uint *)(wt->entropy + 6);
    local_48 = 1;
    local_40 = 0x7fffffff0;
    uVar7 = 0;
    do {
      cA[uVar7] = 0.0;
      cD[uVar7] = 0.0;
      if (0 < (int)uVar2) {
        lVar1 = uVar7 * 2 + 1;
        lVar6 = 0;
        lVar3 = 0;
        lVar8 = local_48;
        do {
          if (lVar8 < N && -1 < lVar8) {
            pdVar5 = (double *)(lVar3 * 8 + (long)wt->eparam);
            pdVar4 = inp + (lVar1 - lVar3);
LAB_00104f71:
            cA[uVar7] = *pdVar5 * *pdVar4 + cA[uVar7];
            cD[uVar7] = *(double *)(*(long *)&wt->N + lVar6) * *pdVar4 + cD[uVar7];
          }
          else {
            if (lVar8 < 0) {
              pdVar5 = (double *)(lVar3 * 8 + (long)wt->eparam);
              pdVar4 = (double *)((long)inp + lVar6 + ((local_40 << 0x1d) >> 0x1d));
              goto LAB_00104f71;
            }
            if (N <= lVar8) {
              pdVar5 = (double *)((long)wt->eparam + lVar6);
              pdVar4 = inp + (long)(N * 2 - (int)lVar1) + lVar3 + -1;
              goto LAB_00104f71;
            }
          }
          lVar3 = lVar3 + 1;
          lVar6 = lVar6 + 8;
          lVar8 = lVar8 + -1;
        } while ((ulong)uVar2 << 3 != lVar6);
      }
      uVar7 = uVar7 + 1;
      local_40 = local_40 + 0x7fffffff0;
      local_48 = local_48 + 2;
    } while (uVar7 != (uint)len_cA);
  }
  return;
}

Assistant:

static void dwpt_sym(wpt_object wt, double *inp, int N, double *cA, int len_cA, double *cD) {
	int i, l, t, len_avg;

	len_avg = wt->wave->lpd_len;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + 1;
		cA[i] = 0.0;
		cD[i] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= 0 && (t - l) < N) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < 0) {
				cA[i] += wt->wave->lpd[l] * inp[-t + l - 1];
				cD[i] += wt->wave->hpd[l] * inp[-t + l - 1];
			}
			else if ((t - l) >= N) {
				cA[i] += wt->wave->lpd[l] * inp[2 * N - t + l - 1];
				cD[i] += wt->wave->hpd[l] * inp[2 * N - t + l - 1];
			}

		}
	}


}